

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O1

bool __thiscall Pda::traverse(Pda *this,string *input)

{
  _Deque_base<char,_std::allocator<char>_> *this_00;
  Pda *n;
  pointer ppNVar1;
  size_t __n;
  char cVar2;
  int iVar3;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar4;
  char *pcVar5;
  _Elt_pointer pcVar6;
  pointer ppTVar7;
  Node *pNVar8;
  Node *pNVar9;
  Pda *pPVar10;
  string *psVar11;
  string *psVar12;
  pointer ppNVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> activeStates;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newActives;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> eclos;
  map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  counter;
  stack<char,_std::deque<char,_std::allocator<char>_>_> s;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> local_260;
  undefined1 local_248 [40];
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Node *local_208;
  pointer local_200;
  _Deque_base<char,_std::allocator<char>_> local_1f8;
  _Deque_base<char,_std::allocator<char>_> local_1a8;
  _Rb_tree<const_char,_std::pair<const_char,_unsigned_int>,_std::_Select1st<std::pair<const_char,_unsigned_int>_>,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  local_158;
  _Deque_base<char,_std::allocator<char>_> local_128;
  undefined1 local_d0 [160];
  
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_128,0);
  local_1a8._M_impl.super__Deque_impl_data._M_map._0_1_ = 0x7a;
  std::deque<char,_std::allocator<char>_>::emplace_back<char>
            ((deque<char,_std::allocator<char>_> *)&local_128,(char *)&local_1a8);
  pNVar8 = this->start;
  std::deque<char,_std::allocator<char>_>::deque
            ((deque<char,_std::allocator<char>_> *)local_d0,
             (deque<char,_std::allocator<char>_> *)&local_128);
  pPVar10 = (Pda *)local_d0;
  Tjen::Node::setStack(pNVar8,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)pPVar10);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)local_d0);
  findEclosure(&local_260,pPVar10,this->start);
  pNVar8 = (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
  local_248._24_8_ = this;
  if (input->_M_string_length != 0) {
    uVar14 = 0;
    do {
      local_248._0_8_ = (Pda *)0x0;
      local_248._8_8_ = 0;
      local_248._16_8_ = 0;
      local_218._8_8_ =
           local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pNVar8 = (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      if (local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          n = (Pda *)(pNVar8->name)._M_dataplus._M_p;
          initMap((map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
                   *)&local_158,pPVar10,(Node *)n);
          pvVar4 = Tjen::Node::getTransitions((Node *)n);
          ppNVar13 = (pointer)(pvVar4->
                              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                              )._M_impl.super__Vector_impl_data._M_start;
          local_200 = (pointer)(pvVar4->
                               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
          local_208 = pNVar8;
          if (ppNVar13 != local_200) {
            do {
              cVar2 = Tjen::Node::Transition::getInput((Transition *)*ppNVar13);
              bVar15 = cVar2 == (input->_M_dataplus)._M_p[uVar14];
              if (bVar15) {
                pcVar5 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar13);
                cVar2 = *pcVar5;
                pPVar10 = n;
                Tjen::Node::getStack
                          ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_1a8,
                           (Node *)n);
                pcVar6 = local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  pcVar6 = local_1a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
                }
                if (cVar2 != pcVar6[-1]) goto LAB_00109862;
                bVar15 = true;
                bVar16 = false;
                bVar17 = true;
              }
              else {
LAB_00109862:
                cVar2 = Tjen::Node::Transition::getInput((Transition *)*ppNVar13);
                bVar16 = cVar2 == ' ';
                if (bVar16) {
                  pcVar5 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar13);
                  cVar2 = *pcVar5;
                  pPVar10 = n;
                  Tjen::Node::getStack
                            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_1f8,
                             (Node *)n);
                  ppTVar7 = (pointer)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    ppTVar7 = (pointer)(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node
                                        [-1] + 0x200);
                  }
                  bVar17 = true;
                  if (cVar2 == *(char *)((long)ppTVar7 + -1)) {
                    bVar16 = true;
                    goto LAB_00109929;
                  }
                }
                cVar2 = Tjen::Node::Transition::getInput((Transition *)*ppNVar13);
                if (cVar2 == (input->_M_dataplus)._M_p[uVar14]) {
                  pcVar5 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar13);
                  bVar17 = true;
                  if (*pcVar5 == ' ') goto LAB_00109929;
                }
                cVar2 = Tjen::Node::Transition::getInput((Transition *)*ppNVar13);
                if (cVar2 == ' ') {
                  pcVar5 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar13);
                  bVar17 = *pcVar5 == ' ';
                }
                else {
                  bVar17 = false;
                }
              }
LAB_00109929:
              if (bVar16) {
                std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1f8);
              }
              if (bVar15) {
                std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1a8);
              }
              this_00 = (_Deque_base<char,_std::allocator<char>_> *)(local_d0 + 0x50);
              if (bVar17) {
                pNVar8 = (Node *)operator_new(0x88);
                pNVar9 = Tjen::Node::Transition::getTo((Transition *)*ppNVar13);
                Tjen::Node::Node(pNVar8,pNVar9);
                Tjen::Node::getStack
                          ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)this_00,
                           (Node *)n);
                Tjen::Node::setStack
                          (pNVar8,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)this_00);
                std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(this_00);
                pPVar10 = (Pda *)Tjen::Node::Transition::getNewstack_abi_cxx11_
                                           ((Transition *)*ppNVar13);
                Tjen::Node::editStack(pNVar8,(string *)pPVar10);
                findEclosure((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)
                             (local_248 + 0x20),pPVar10,pNVar8);
                pPVar10 = (Pda *)local_248._0_8_;
                std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>>
                          ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)local_248,
                           local_248._0_8_,local_248._32_8_,local_220);
                if ((pointer)local_248._32_8_ != (pointer)0x0) {
                  pPVar10 = (Pda *)(local_218._M_allocated_capacity - local_248._32_8_);
                  operator_delete((void *)local_248._32_8_,(ulong)pPVar10);
                }
              }
              ppNVar13 = ppNVar13 + 1;
            } while (ppNVar13 != local_200);
          }
          std::
          _Rb_tree<const_char,_std::pair<const_char,_unsigned_int>,_std::_Select1st<std::pair<const_char,_unsigned_int>_>,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
          ::~_Rb_tree(&local_158);
          pNVar8 = (Node *)&(local_208->name)._M_string_length;
          this = (Pda *)local_248._24_8_;
        } while (pNVar8 != (Node *)local_218._8_8_);
      }
      pPVar10 = (Pda *)local_248;
      std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator=
                (&local_260,(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)pPVar10);
      if ((Pda *)local_248._0_8_ != (Pda *)0x0) {
        pPVar10 = (Pda *)(local_248._16_8_ - local_248._0_8_);
        operator_delete((void *)local_248._0_8_,(ulong)pPVar10);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      pNVar8 = (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < input->_M_string_length);
  }
  for (; pNVar8 != (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      pNVar8 = (Node *)&(pNVar8->name)._M_string_length) {
    ppNVar13 = (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppNVar1 = (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppNVar13 != ppNVar1) {
      pNVar9 = (Node *)(pNVar8->name)._M_dataplus._M_p;
      do {
        psVar11 = Tjen::Node::getName_abi_cxx11_(*ppNVar13);
        psVar12 = Tjen::Node::getName_abi_cxx11_(pNVar9);
        __n = psVar11->_M_string_length;
        if ((__n == psVar12->_M_string_length) &&
           ((__n == 0 ||
            (iVar3 = bcmp((psVar11->_M_dataplus)._M_p,(psVar12->_M_dataplus)._M_p,__n), iVar3 == 0))
           )) goto LAB_00109ac8;
        ppNVar13 = ppNVar13 + 1;
      } while (ppNVar13 != ppNVar1);
    }
    this = (Pda *)local_248._24_8_;
  }
LAB_00109ac8:
  if ((Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != (Node *)0x0) {
    operator_delete(local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_128);
  return pNVar8 != (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool Pda::traverse(std::string input) {

    //init
    std::stack<char> s;
    s.push('z');
    this->getStart()->setStack(s);
    std::vector<Tjen::Node*> activeStates = {findEclosure(this->getStart())};


    //begin traverse
    for (unsigned int i = 0; i < input.size(); ++i) {
        std::vector<Tjen::Node*> newActives;


        // loop over active states
        for(Tjen::Node* n: activeStates){
            std::map<const char, unsigned int> counter = initMap(n);
            // loop over transition
            for(auto& f: n->getTransitions()){
                if((f->getInput() == input[i] && f->getOldStack() == n->getStack().top()) || (f->getInput() == ' ' && f->getOldStack() == n->getStack().top()) || (f->getInput() == input[i] && f->getOldStack() == ' ') || (f->getInput() == ' ' && f->getOldStack() == ' ') ){

                    //eclosurre adden

                    Tjen::Node* next = new Tjen::Node(f->getTo());
                    next->setStack(n->getStack());
                    next->editStack(f->getNewstack());
                    std::vector<Tjen::Node*> eclos = findEclosure(next);

                    newActives.insert(newActives.begin(),eclos.begin() , eclos.end());


                }
            }
        }
        activeStates = newActives;

    }

    for(Tjen::Node* n : activeStates){
        for(Tjen::Node* end : this->getEndNodes()){
            if(end->getName() == n->getName()){
                return true;
            }
        }
    }
    return false;

}